

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_depth_decomposition.h
# Opt level: O0

ArrayIDIDFunc *
compute_tree_depth_order_of_connected_graph<flow_cutter::ComputeSeparator>
          (ArrayIDIDFunc *tail,ArrayIDIDFunc *head,ComputeSeparator *compute_separator,
          int tree_depth_must_be_below)

{
  bool bVar1;
  int iVar2;
  ArrayIDIDFunc *in_RDX;
  ArrayIDIDFunc *in_RSI;
  ArrayIDIDFunc *in_RDI;
  int in_R8D;
  int nd_order_depth;
  ArrayIDIDFunc nd_order;
  vector<int,_std::allocator<int>_> separator;
  ArrayIDIDFunc *in_stack_00000098;
  anon_class_24_3_8acad44f *in_stack_000000a0;
  vector<int,_std::allocator<int>_> *in_stack_000000a8;
  int best_order_depth;
  ArrayIDIDFunc best_order;
  bool is_clique;
  bool is_tree;
  int arc_count;
  int node_count;
  int in_stack_00000214;
  ArrayIDIDFunc *in_stack_00000218;
  ArrayIDIDFunc *in_stack_00000220;
  ComputeSeparator *in_stack_00000228;
  ArrayIDIDFunc *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  vector<int,_std::allocator<int>_> *this;
  int in_stack_ffffffffffffff2c;
  ArrayIDIDFunc *tail_00;
  ArrayIDFunc<int> local_90;
  ArrayIDIDFunc *in_stack_ffffffffffffff80;
  ArrayIDIDFunc *in_stack_ffffffffffffff88;
  int local_4c;
  vector<int,_std::allocator<int>_> local_48;
  undefined1 local_2e;
  undefined1 local_2d;
  int local_2c;
  int local_28;
  int local_24 [9];
  
  tail_00 = in_RDI;
  local_24[0] = in_R8D;
  local_28 = ArrayIDIDFunc::image_count(in_RSI);
  local_2c = ArrayIDFunc<int>::preimage_count(&in_RSI->super_ArrayIDFunc<int>);
  local_2d = local_2c == (local_28 + -1) * 2;
  local_2e = local_2c == local_28 * (local_28 + -1);
  if ((bool)local_2d) {
    compute_tree_depth_order_of_tree<ArrayIDIDFunc,ArrayIDIDFunc>
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  }
  else if ((bool)local_2e) {
    identity_permutation(in_stack_ffffffffffffff2c);
  }
  else {
    this = &local_48;
    compute_greedy_order
              (in_stack_00000098,
               (ArrayIDIDFunc *)
               separator.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    local_4c = compute_tree_depth_of_order(tail_00,in_RDI,in_RDX);
    std::min<int>(local_24,&local_4c);
    flow_cutter::ComputeSeparator::operator()
              (in_stack_00000228,in_stack_00000220,in_stack_00000218,in_stack_00000214);
    bVar1 = std::vector<int,_std::allocator<int>_>::empty(this);
    if (!bVar1) {
      compute_nested_disection_order_by_splitting_along_separator<compute_tree_depth_order_of_connected_graph<flow_cutter::ComputeSeparator>(ArrayIDIDFunc,ArrayIDIDFunc,flow_cutter::ComputeSeparator_const&,int)::_lambda(ArrayIDIDFunc,ArrayIDIDFunc)_1_>
                ((ArrayIDIDFunc *)best_order.super_ArrayIDFunc<int>.data_,
                 (ArrayIDIDFunc *)best_order.super_ArrayIDFunc<int>._0_8_,in_stack_000000a8,
                 in_stack_000000a0);
      iVar2 = ArrayIDFunc<int>::preimage_count(&local_90);
      if ((iVar2 != 0) &&
         (iVar2 = compute_tree_depth_of_order(tail_00,in_RDI,in_RDX),
         in_stack_ffffffffffffff14 = iVar2, iVar2 < local_4c)) {
        ArrayIDIDFunc::operator=
                  ((ArrayIDIDFunc *)CONCAT44(iVar2,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff08);
        local_4c = iVar2;
      }
      ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x17a40d);
    }
    if (local_24[0] < local_4c) {
      ArrayIDIDFunc::ArrayIDIDFunc
                ((ArrayIDIDFunc *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    }
    else {
      ArrayIDIDFunc::ArrayIDIDFunc
                ((ArrayIDIDFunc *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08);
    }
    std::vector<int,_std::allocator<int>_>::~vector(this);
    ArrayIDIDFunc::~ArrayIDIDFunc((ArrayIDIDFunc *)0x17a465);
  }
  return tail_00;
}

Assistant:

ArrayIDIDFunc compute_tree_depth_order_of_connected_graph(
    ArrayIDIDFunc tail, ArrayIDIDFunc head,
    const ComputeSeparator& compute_separator,
    int tree_depth_must_be_below)
{
    assert(tail.preimage_count() == head.preimage_count());
    assert(tail.image_count() == head.image_count());
    assert(is_symmetric(tail, head));

    const int node_count = tail.image_count();
    const int arc_count = tail.preimage_count();
    bool is_tree = (arc_count == 2 * (node_count - 1));
    bool is_clique = (arc_count == (node_count) * (node_count - 1));

    if (is_tree) {
        return compute_tree_depth_order_of_tree(std::move(tail), std::move(head));
    } else if (is_clique) {
        return identity_permutation(node_count);
    } else {
        ArrayIDIDFunc best_order = compute_greedy_order(tail, head);
        int best_order_depth = compute_tree_depth_of_order(tail, head, best_order);

        // If we computed a separator with size tree_depth_must_be_below or more, then the tree depth would also be at least tree_depth_must_be_below as the separator forms a path.
        // If we computed a separator with size best_order_depth or more, then it cannot be better than best_order_depth as the separator forms a path.
        std::vector<int> separator = compute_separator(tail, head, std::min(tree_depth_must_be_below, best_order_depth) - 1);
        if (!separator.empty()) {
            ArrayIDIDFunc nd_order = compute_nested_disection_order_by_splitting_along_separator(
                tail, head, separator,
                [&](ArrayIDIDFunc sub_tail, ArrayIDIDFunc sub_head) {
                    return compute_tree_depth_order_of_connected_graph(std::move(sub_tail), std::move(sub_head), compute_separator, std::min(tree_depth_must_be_below, best_order_depth) - 1);
                });
            if(nd_order.preimage_count() != 0){
                int nd_order_depth = compute_tree_depth_of_order(tail, head, nd_order);
                if (nd_order_depth < best_order_depth) {
                    best_order = std::move(nd_order);
                    best_order_depth = nd_order_depth;
                }
            }
        }

        if(best_order_depth > tree_depth_must_be_below)
            return ArrayIDIDFunc();
        else
            return std::move(best_order);
    }
}